

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigcache.cpp
# Opt level: O1

bool __thiscall
CachingTransactionSignatureChecker::VerifyECDSASignature
          (CachingTransactionSignatureChecker *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,CPubKey *pubkey,
          uint256 *sighash)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  uint256 entry;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_58.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  SignatureCache::ComputeEntryECDSA(this->m_signature_cache,&local_58,sighash,vchSig,pubkey);
  bVar1 = SignatureCache::Get(this->m_signature_cache,&local_58,(bool)(this->store ^ 1));
  bVar2 = true;
  if (!bVar1) {
    bVar1 = GenericTransactionSignatureChecker<CTransaction>::VerifyECDSASignature
                      (&this->super_TransactionSignatureChecker,vchSig,pubkey,sighash);
    if (bVar1) {
      if (this->store == true) {
        SignatureCache::Set(this->m_signature_cache,&local_58);
      }
    }
    else {
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CachingTransactionSignatureChecker::VerifyECDSASignature(const std::vector<unsigned char>& vchSig, const CPubKey& pubkey, const uint256& sighash) const
{
    uint256 entry;
    m_signature_cache.ComputeEntryECDSA(entry, sighash, vchSig, pubkey);
    if (m_signature_cache.Get(entry, !store))
        return true;
    if (!TransactionSignatureChecker::VerifyECDSASignature(vchSig, pubkey, sighash))
        return false;
    if (store)
        m_signature_cache.Set(entry);
    return true;
}